

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_Tag.cpp
# Opt level: O3

void __thiscall psy::C::TagType::TagType(TagType *this,TagTypeKind tagTyK,Identifier *tag)

{
  TypeImpl *pTVar1;
  anon_union_4_2_c94a1d5b_for_TypeImpl_0 *p;
  
  p = (anon_union_4_2_c94a1d5b_for_TypeImpl_0 *)operator_new(0x18);
  *p = (anon_union_4_2_c94a1d5b_for_TypeImpl_0)0x5;
  *(Identifier **)(p + 2) = tag;
  *(undefined8 *)(p + 4) = 0;
  Type::Type(&this->super_Type,(TypeImpl *)&p->F_);
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__Type_00522108;
  pTVar1 = (this->super_Type).impl_._M_t.
           super___uniq_ptr_impl<psy::C::Type::TypeImpl,_std::default_delete<psy::C::Type::TypeImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_psy::C::Type::TypeImpl_*,_std::default_delete<psy::C::Type::TypeImpl>_>
           .super__Head_base<0UL,_psy::C::Type::TypeImpl_*,_false>._M_head_impl;
  *(ushort *)&pTVar1->field_0 =
       (ushort)(pTVar1->field_0).BD_ & 0xe7ff | (ushort)(tagTyK & (Enum|Union)) << 0xb;
  return;
}

Assistant:

TagType::TagType(TagTypeKind tagTyK, const Identifier* tag)
    : Type(new TagTypeImpl(tagTyK, tag))
{
    P->F_.tagTyK_ = static_cast<std::uint32_t>(tagTyK);
}